

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefilt.c
# Opt level: O0

void qmf_wrev(double *in,int N,double *out)

{
  double *out_00;
  double *sigOutTemp;
  double *out_local;
  int N_local;
  double *in_local;
  
  out_00 = (double *)malloc((long)N << 3);
  qmf_even(in,N,out_00);
  copy_reverse(out_00,N,out);
  free(out_00);
  return;
}

Assistant:

void qmf_wrev(const double *in, int N, double *out)
{
    double *sigOutTemp;
    sigOutTemp = (double*)malloc(N*sizeof(double));

    qmf_even(in, N, sigOutTemp);
    copy_reverse(sigOutTemp, N, out);

    free(sigOutTemp);
    return;
}